

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::ResidualCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *residual,int icase)

{
  double dVar1;
  double *pdVar2;
  TPZTensor<double> *source;
  uint in_EDX;
  TPZFMatrix<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double dVar3;
  int i_1;
  int numequal;
  TPZDecomposed objdec;
  int i;
  TPZTensor<double> obj;
  int in_stack_fffffffffffffc3c;
  TPZDecomposed *in_stack_fffffffffffffc40;
  TPZTensor<double> *in_stack_fffffffffffffc50;
  int64_t in_stack_fffffffffffffc58;
  TPZFMatrix<double> *in_stack_fffffffffffffc60;
  TPZDecomposed *this;
  uint local_2f0;
  int local_2ec;
  TPZVec<double> local_2b0 [17];
  int local_74;
  uint local_14;
  TPZFMatrix<double> *local_10;
  TPZFMatrix<double> *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZTensor<double>::TPZTensor(in_stack_fffffffffffffc50);
  for (local_74 = 0; local_74 < 6; local_74 = local_74 + 1) {
    pdVar2 = TPZFMatrix<double>::operator()(local_8,(long)local_74);
    dVar3 = *pdVar2;
    pdVar2 = TPZTensor<double>::operator[]
                       ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    *pdVar2 = dVar3;
  }
  pdVar2 = TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(local_8,6);
  dVar1 = *pdVar2;
  pdVar2 = TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  *pdVar2 = dVar3 * 0.5 + dVar1 * 0.5;
  pdVar2 = TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(local_8,7);
  dVar1 = *pdVar2;
  pdVar2 = TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  *pdVar2 = (dVar3 + dVar1) * 0.5;
  pdVar2 = TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  this = (TPZDecomposed *)*pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(local_8,8);
  dVar3 = (double)this + *pdVar2;
  source = (TPZTensor<double> *)
           TPZTensor<double>::operator[]
                     ((TPZTensor<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  (source->super_TPZSavable)._vptr_TPZSavable = (_func_int **)(dVar3 * 0.5);
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(this,source);
  (*(local_10->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (local_10,1);
  if (local_14 < 3) {
    pdVar2 = TPZVec<double>::operator[](local_2b0,(long)(int)local_14);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                        (int64_t)in_stack_fffffffffffffc50);
    *pdVar2 = dVar3;
    local_2ec = 1;
    for (local_2f0 = 0; (int)local_2f0 < 3; local_2f0 = local_2f0 + 1) {
      if (local_2f0 != local_14) {
        if ((gEigval[(int)local_2f0] == gEigval[(int)local_14]) &&
           (!NAN(gEigval[(int)local_2f0]) && !NAN(gEigval[(int)local_14]))) {
          local_2ec = local_2ec + 1;
          pdVar2 = TPZVec<double>::operator[](local_2b0,(long)(int)local_2f0);
          dVar3 = *pdVar2;
          pdVar2 = TPZFMatrix<double>::operator()(local_10,0);
          *pdVar2 = dVar3 + *pdVar2;
        }
      }
    }
    in_stack_fffffffffffffc40 = (TPZDecomposed *)(double)local_2ec;
    pdVar2 = TPZFMatrix<double>::operator()(local_10,0);
    *pdVar2 = *pdVar2 / (double)in_stack_fffffffffffffc40;
  }
  TPZTensor<double>::TPZDecomposed::~TPZDecomposed(in_stack_fffffffffffffc40);
  TPZTensor<double>::~TPZTensor((TPZTensor<double> *)0x14b1ec5);
  return;
}

Assistant:

static void ResidualCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &residual, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            obj[_XY_] = obj[_XY_]*0.5 + 0.5 * state(6);
            obj[_XZ_] = (obj[_XZ_] + state(7))*0.5;
            obj[_YZ_] = (obj[_YZ_] + state(8))*0.5;
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            residual.Resize(1, 1);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    residual(0, 0) = objdec.fEigenvalues[icase];
                    int numequal = 1;
                    for (int i = 0; i < 3; i++) {
                        if (i == icase) {
                            continue;
                        }
                        if (gEigval[i] == gEigval[icase]) {
                            numequal++;
                            residual(0) += objdec.fEigenvalues[i];
                        }
                    }
                    residual(0) /= numequal;
                }
                    break;

                default:
                    break;
            }
        }